

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcanpty.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  undefined *puVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint __fd;
  uint __fd_00;
  char *pcVar7;
  ssize_t sVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 *__optval;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  socklen_t __optlen;
  byte *pbVar17;
  uint uVar18;
  char replybuf [10];
  char buf [33];
  can_filter fi;
  fd_set rdfs;
  sockaddr_can addr;
  char local_1a8;
  undefined2 uStack_1a7;
  byte bStack_1a5;
  byte local_1a4;
  undefined2 uStack_1a3;
  byte abStack_1a0 [8];
  ulong local_198;
  uint local_190;
  undefined4 local_18c;
  ulong local_188;
  undefined *local_180;
  uint local_178;
  byte local_174;
  byte local_170 [28];
  int local_154;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  undefined8 local_130;
  long local_128;
  long local_120;
  fd_set local_118;
  sockaddr local_90;
  termios local_78;
  
  if (argc != 3) {
    main_cold_1();
    return 1;
  }
  local_118.fds_bits[1] = 0;
  local_118.fds_bits[2] = 0;
  local_118.fds_bits[3] = 0;
  local_118.fds_bits[4] = 0;
  local_118.fds_bits[5] = 0;
  local_118.fds_bits[6] = 0;
  local_118.fds_bits[7] = 0;
  local_118.fds_bits[8] = 0;
  local_118.fds_bits[9] = 0;
  local_118.fds_bits[10] = 0;
  local_118.fds_bits[0xb] = 0;
  local_118.fds_bits[0xc] = 0;
  local_118.fds_bits[0xd] = 0;
  local_118.fds_bits[0xe] = 0;
  local_118.fds_bits[0xf] = 0;
  local_118.fds_bits[0] = 1;
  local_78.c_iflag = 0;
  local_78.c_oflag = 0;
  local_78.c_cflag = 0;
  local_78.c_lflag = 0;
  uVar12 = 0;
  iVar6 = select(1,&local_118,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&local_78);
  local_18c = (undefined4)CONCAT71((int7)((ulong)uVar12 >> 8),1);
  if ((-1 < iVar6) && ((iVar6 == 0 || (iVar6 = getchar(), iVar6 != -1)))) {
    local_18c = 0;
  }
  __fd = open(argv[1],2);
  if ((int)__fd < 0) {
    pcVar7 = "open pty";
    goto LAB_00101c80;
  }
  iVar6 = tcgetattr(__fd,&local_78);
  if (iVar6 != 0) {
    pcVar7 = "tcgetattr";
    goto LAB_00101c80;
  }
  local_78._8_8_ = local_78._8_8_ & 0xfffff385ffffffff;
  local_78._0_8_ = local_78._0_8_ & 0xfffffffffffffebf | 0x40;
  tcsetattr(__fd,0,&local_78);
  iVar6 = strcmp(argv[1],"/dev/ptmx");
  if (iVar6 == 0) {
    iVar6 = grantpt(__fd);
    if (iVar6 < 0) {
      pcVar7 = "grantpt";
LAB_00101ca5:
      perror(pcVar7);
      iVar6 = 1;
      bVar2 = false;
    }
    else {
      iVar6 = unlockpt(__fd);
      if (iVar6 < 0) {
        pcVar7 = "unlockpt";
        goto LAB_00101ca5;
      }
      pcVar7 = ptsname(__fd);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "ptsname";
        goto LAB_00101ca5;
      }
      iVar6 = 0;
      printf("open: %s: slave pseudo-terminal is %s\n",argv[1],pcVar7);
      bVar2 = true;
    }
    if (!bVar2) {
      return iVar6;
    }
  }
  __fd_00 = socket(0x1d,3,1);
  if ((int)__fd_00 < 0) {
    pcVar7 = "socket";
  }
  else {
    local_90.sa_family = 0x1d;
    local_90.sa_data._2_4_ = if_nametoindex(argv[2]);
    if (local_90.sa_data._2_4_ == 0) {
      pcVar7 = "if_nametoindex";
LAB_00101c80:
      perror(pcVar7);
      return 1;
    }
    setsockopt(__fd_00,0x65,1,(void *)0x0,0);
    iVar6 = bind(__fd_00,&local_90,0x18);
    if (-1 < iVar6) {
      local_130 = 0;
      local_138 = 1L << ((byte)__fd & 0x3f);
      local_148 = 1L << ((byte)__fd_00 & 0x3f);
      local_140 = (ulong)(__fd >> 6);
      local_150 = (ulong)(__fd_00 >> 6);
      local_154 = __fd_00 + 1;
      local_190 = 0;
LAB_0010155b:
      do {
        local_118.fds_bits[0xe] = 0;
        local_118.fds_bits[0xf] = 0;
        local_118.fds_bits[0xc] = 0;
        local_118.fds_bits[0xd] = 0;
        local_118.fds_bits[10] = 0;
        local_118.fds_bits[0xb] = 0;
        local_118.fds_bits[8] = 0;
        local_118.fds_bits[9] = 0;
        local_118.fds_bits[6] = 0;
        local_118.fds_bits[7] = 0;
        local_118.fds_bits[4] = 0;
        local_118.fds_bits[5] = 0;
        local_118.fds_bits[2] = 0;
        local_118.fds_bits[3] = 0;
        local_118.fds_bits[0] = 0;
        local_118.fds_bits[1] = 0;
        if ((char)local_18c == '\0') {
          local_118.fds_bits[0] = 1;
        }
        local_118.fds_bits[0] = (__fd_mask)((char)local_18c == '\0');
        local_118.fds_bits[local_140] = local_118.fds_bits[local_140] | local_138;
        local_118.fds_bits[local_150] = local_118.fds_bits[local_150] | local_148;
        iVar6 = select(local_154,&local_118,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
        if (iVar6 < 0) {
          pcVar7 = "select";
          goto LAB_00101c80;
        }
        if ((local_118.fds_bits[0] & 1U) != 0) goto LAB_00101ccb;
        if ((local_118.fds_bits[local_140] & local_138) != 0) {
          sVar8 = read(__fd,&pty2can_buf + pty2can_rxoffset,199 - (ulong)pty2can_rxoffset);
          iVar6 = (int)sVar8;
          if (0 < iVar6) {
            uVar15 = iVar6 + pty2can_rxoffset;
            pty2can_rxoffset = 0;
LAB_00101652:
            uVar16 = (ulong)uVar15;
            if ((pty2can_buf == 0xd) && (sVar9 = uVar16, uVar15 != 0)) {
              do {
                memmove(&pty2can_buf,&DAT_001061a1,sVar9);
                uVar16 = sVar9 - 1;
                if ((int)sVar9 == 1) break;
                sVar9 = uVar16;
              } while (pty2can_buf == 0xd);
            }
            bVar4 = pty2can_buf;
            bVar2 = true;
            uVar15 = (uint)uVar16;
            uVar11 = pty2can_rxoffset;
            if (uVar15 == 0) goto LAB_00101a33;
            uVar13 = 0;
            do {
              if ((&pty2can_buf)[uVar13] == '\r') goto LAB_001016a9;
              uVar13 = uVar13 + 1;
            } while ((uVar16 & 0xffffffff) != uVar13);
            uVar13 = uVar16 & 0xffffffff;
LAB_001016a9:
            uVar11 = uVar15;
            if ((uint)uVar13 == uVar15) goto LAB_00101a33;
            (&pty2can_buf)[uVar16 & 0xffffffff] = 0;
            if ((bVar4 & 0xdf) == 0x4d) {
              DAT_001061a9 = 0;
              uVar18 = 9;
              goto LAB_001019a4;
            }
            uVar18 = 2;
            switch(bVar4) {
            case 0x41:
            case 0x50:
              uVar18 = 1;
              break;
            case 0x42:
            case 0x44:
            case 0x45:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4a:
            case 0x4b:
            case 0x4c:
            case 0x4d:
            case 0x51:
            case 0x57:
            case 0x59:
              goto switchD_001016f6_caseD_42;
            case 0x43:
              __optval = (undefined8 *)0x0;
              __optlen = 0;
              goto LAB_001018df;
            case 0x46:
              local_1a4 = 0;
              local_1a8 = 'F';
              uStack_1a7 = 0x3030;
              bStack_1a5 = 0xd;
              goto LAB_0010193d;
            case 0x4e:
              local_1a4 = 0x32;
              uStack_1a3 = 0xd;
              local_1a8 = 'N';
              uStack_1a7 = 0x3234;
              bStack_1a5 = 0x34;
              goto LAB_0010193d;
            case 0x4f:
              __optval = &local_130;
              __optlen = 8;
LAB_001018df:
              uVar18 = 1;
              setsockopt(__fd_00,0x65,1,__optval,__optlen);
              goto switchD_001016f6_caseD_53;
            case 0x52:
            case 0x54:
switchD_001016f6_caseD_52:
              iVar6 = (uint)((bVar4 & 0x20) == 0) * 5;
              uVar18 = iVar6 + 4;
              local_170[0] = 0;
              local_170[1] = 0;
              local_170[2] = 0;
              local_170[3] = 0;
              local_170[4] = 0;
              local_170[5] = 0;
              local_170[6] = 0;
              local_170[7] = 0;
              uVar16 = (ulong)uVar18;
              if (((bVar4 & 0x56) == 0x52) && (cVar1 = (&pty2can_buf)[uVar16], cVar1 != '0')) {
                (&pty2can_buf)[uVar16] = 0;
                local_198 = uVar16;
                local_174 = cVar1;
                uVar16 = strtoul((char *)&DAT_001061a1,(char **)0x0,0x10);
                local_178 = (bVar4 & 0x20) * 0x4000000 + 0xc0000000 | (uint)uVar16;
                (&pty2can_buf)[local_198] = cVar1;
                local_174 = 0;
                uVar18 = iVar6 + 3;
              }
              else {
                bVar10 = (&pty2can_buf)[uVar16] - 0x30;
                if (8 < bVar10) break;
                (&pty2can_buf)[uVar16] = 0;
                local_198 = uVar16;
                local_174 = bVar10;
                uVar16 = strtoul((char *)&DAT_001061a1,(char **)0x0,0x10);
                uVar11 = (uint)uVar16 | 0x80000000;
                if ((bVar4 & 0x20) != 0) {
                  uVar11 = (uint)uVar16;
                }
                local_178 = uVar11 | 0x40000000;
                if ((bVar4 & 0x56) != 0x52) {
                  local_178 = uVar11;
                }
                if (bVar10 == 0) {
                  iVar6 = iVar6 + 5;
                }
                else {
                  local_180 = &DAT_001061a2 + local_198;
                  local_188 = (ulong)((uint)bVar10 * 2);
                  pbVar17 = local_170;
                  uVar16 = 0;
                  do {
                    puVar3 = local_180;
                    bVar4 = asc2nibble(local_180[uVar16 - 1]);
                    if (0xf < bVar4) {
                      uVar18 = (int)local_198 + (int)uVar16 + 2;
                      goto LAB_00101970;
                    }
                    *pbVar17 = bVar4 << 4;
                    bVar5 = asc2nibble(puVar3[uVar16]);
                    if (0xf < bVar5) {
                      uVar18 = (int)local_198 + (int)uVar16 + 3;
                      goto LAB_00101970;
                    }
                    *pbVar17 = bVar5 | bVar4 << 4;
                    uVar16 = uVar16 + 2;
                    pbVar17 = pbVar17 + 1;
                  } while (local_188 != uVar16);
                  iVar6 = (int)local_198 + (int)uVar16 + 1;
                }
                uVar18 = iVar6 + -1 + (uint)(bVar10 == 0);
              }
              sVar8 = write(__fd_00,&local_178,0x10);
              if ((int)sVar8 == 0x10) goto LAB_001019a4;
              pcVar7 = "write socket";
              goto LAB_00101c2a;
            case 0x53:
            case 0x55:
              goto switchD_001016f6_caseD_53;
            case 0x56:
              local_1a4 = 0x33;
              uStack_1a3 = 0xd;
              local_1a8 = 'V';
              uStack_1a7 = 0x3031;
              bStack_1a5 = 0x31;
LAB_0010193d:
              sVar9 = strlen(&local_1a8);
              uVar11 = (uint)sVar9;
              uVar18 = 1;
              goto LAB_001019ae;
            case 0x58:
              uVar18 = 2;
              if ((DAT_001061a1 & 1) != 0) goto switchD_001016f6_caseD_53;
              break;
            case 0x5a:
              local_190 = DAT_001061a1 & 1;
              goto switchD_001016f6_caseD_53;
            default:
              switch(bVar4) {
              case 0x72:
              case 0x74:
                goto switchD_001016f6_caseD_52;
              case 0x73:
                uVar18 = 5;
                goto switchD_001016f6_caseD_53;
              case 0x76:
                local_1a4 = 0x34;
                uStack_1a3 = 0xd;
                local_1a8 = 'v';
                uStack_1a7 = 0x3031;
                bStack_1a5 = 0x31;
                goto LAB_0010193d;
              }
              goto switchD_001016f6_caseD_42;
            }
            goto LAB_00101970;
          }
          if (iVar6 < 0) {
            pcVar7 = "read pty";
LAB_00101c2a:
            perror(pcVar7);
          }
          bVar2 = false;
          uVar11 = pty2can_rxoffset;
LAB_00101a33:
          pty2can_rxoffset = uVar11;
          if (!bVar2) goto LAB_00101ccb;
        }
      } while ((local_118.fds_bits[local_150] & local_148) == 0);
      sVar8 = read(__fd_00,&local_1a8,0x10);
      if ((int)sVar8 == 0x10) {
        uVar15 = (uint)((bStack_1a5 & 0x40) == 0) * 2 + 0x52;
        if ((char)bStack_1a5 < '\0') {
          uVar11 = CONCAT13(bStack_1a5,CONCAT21(uStack_1a7,local_1a8)) & 0x1fffffff;
          pcVar7 = "%c%08X%d";
        }
        else {
          uVar15 = uVar15 | 0x20;
          uVar11 = CONCAT21(uStack_1a7,local_1a8) & 0x7ff;
          pcVar7 = "%c%03X%d";
        }
        sprintf((char *)&local_178,pcVar7,(ulong)uVar15,(ulong)uVar11);
        local_180 = (undefined *)strlen((char *)&local_178);
        puVar3 = local_180;
        uVar16 = (ulong)local_1a4;
        local_188 = uVar16;
        if (local_1a4 != 0) {
          pcVar7 = (char *)((long)&local_178 + (long)(int)local_180);
          uVar13 = 0;
          local_180 = puVar3;
          do {
            sprintf(pcVar7,"%02X",(ulong)abStack_1a0[uVar13]);
            uVar13 = uVar13 + 1;
            pcVar7 = pcVar7 + 2;
          } while (uVar16 != uVar13);
        }
        if (local_190 != 0) {
          iVar6 = ioctl(__fd_00,0x8906,&local_128);
          if (iVar6 < 0) {
            perror("SIOCGSTAMP");
          }
          sprintf((char *)((long)&local_178 + (long)((int)local_180 + (int)local_188 * 2)),"%04llX",
                  local_120 / 1000 + (local_128 % 0x3c) * 1000);
        }
        sVar9 = strlen((char *)&local_178);
        *(undefined2 *)((long)&local_178 + sVar9) = 0xd;
        sVar9 = strlen((char *)&local_178);
        sVar8 = write(__fd,&local_178,sVar9);
        if (-1 < (int)sVar8) {
          fflush((FILE *)0x0);
          goto LAB_0010155b;
        }
        pcVar7 = "write pty";
      }
      else {
        pcVar7 = "read socket";
      }
      perror(pcVar7);
LAB_00101ccb:
      close(__fd);
      close(__fd_00);
      return 0;
    }
    pcVar7 = "bind";
  }
  perror(pcVar7);
  return 1;
switchD_001016f6_caseD_53:
LAB_001019a4:
  local_1a8 = '\r';
  goto LAB_001019a9;
switchD_001016f6_caseD_42:
  uVar18 = uVar15 - 1;
LAB_00101970:
  local_1a8 = '\a';
LAB_001019a9:
  uVar11 = 1;
LAB_001019ae:
  bVar2 = true;
  sVar8 = write(__fd,&local_1a8,(ulong)uVar11);
  if ((int)sVar8 < 0) {
    pcVar7 = "write pty replybuf";
    goto LAB_00101c2a;
  }
  uVar11 = pty2can_rxoffset;
  if (uVar15 <= uVar18 + 1) goto LAB_00101a33;
  uVar15 = uVar15 + ~uVar18;
  lVar14 = 0;
  do {
    (&pty2can_buf)[lVar14] = (&pty2can_buf)[(ulong)(uVar18 + 1) + lVar14];
    lVar14 = lVar14 + 1;
  } while (uVar15 != (uint)lVar14);
  goto LAB_00101652;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int p; /* pty master file */
	int s; /* can raw socket */
	struct sockaddr_can addr;
	struct termios topts;
	int select_stdin = 0;
	int running = 1;
	int tstamp = 0;
	int is_open = 0;
	struct can_filter fi;

	/* check command line options */
	if (argc != 3) {
		print_usage(basename(argv[0]));
		return 1;
	}

	select_stdin = check_select_stdin();

	/* open pty */
	p = open(argv[1], O_RDWR);
	if (p < 0) {
		perror("open pty");
		return 1;
	}

	if (tcgetattr(p, &topts)) {
		perror("tcgetattr");
		return 1;
	}

	/* disable local echo which would cause double frames */
	topts.c_lflag &= ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL | ECHOPRT | ECHOKE);
	topts.c_iflag &= ~(ICRNL);
	topts.c_iflag |= INLCR;
	tcsetattr(p, TCSANOW, &topts);

	/* Support for the Unix 98 pseudo-terminal interface /dev/ptmx /dev/pts/N */
	if (strcmp(argv[1], DEVICE_NAME_PTMX) == 0) {
		char *name_pts = NULL; /* slave pseudo-terminal device name */

		if (grantpt(p) < 0) {
			perror("grantpt");
			return 1;
		}

		if (unlockpt(p) < 0) {
			perror("unlockpt");
			return 1;
		}

		name_pts = ptsname(p);
		if (name_pts == NULL) {
			perror("ptsname");
			return 1;
		}
		printf("open: %s: slave pseudo-terminal is %s\n", argv[1], name_pts);
	}

	/* open socket */
	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[2]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/* disable reception of CAN frames until we are opened by 'O' */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* open filter by default */
	fi.can_id = 0;
	fi.can_mask = 0;

	while (running) {
		FD_ZERO(&rdfs);

		if (select_stdin)
			FD_SET(0, &rdfs);

		FD_SET(p, &rdfs);
		FD_SET(s, &rdfs);

		if (select(s + 1, &rdfs, NULL, NULL, NULL) < 0) {
			perror("select");
			return 1;
		}

		if (FD_ISSET(0, &rdfs)) {
			running = 0;
			continue;
		}

		if (FD_ISSET(p, &rdfs))
			if (pty2can(p, s, &fi, &is_open, &tstamp)) {
				running = 0;
				continue;
			}

		if (FD_ISSET(s, &rdfs))
			if (can2pty(p, s, &tstamp)) {
				running = 0;
				continue;
			}
	}

	close(p);
	close(s);

	return 0;
}